

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

void Sim_CollectNodes_rec(Abc_Obj_t *pRoot,Vec_Ptr_t *vField)

{
  int iVar1;
  Abc_Obj_t *pRoot_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vField_local;
  Abc_Obj_t *pRoot_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pRoot);
  if ((iVar1 == 0) && (iVar1 = Abc_NodeIsTravIdPrevious(pRoot), iVar1 != 0)) {
    Abc_NodeSetTravIdCurrent(pRoot);
    for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pRoot), local_24 < iVar1; local_24 = local_24 + 1) {
      pRoot_00 = Abc_ObjFanin(pRoot,local_24);
      Sim_CollectNodes_rec(pRoot_00,vField);
    }
    iVar1 = Abc_ObjIsCo(pRoot);
    if (iVar1 == 0) {
      iVar1 = Vec_PtrSize(vField);
      pRoot->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)iVar1;
    }
    Vec_PtrPush(vField,pRoot);
  }
  return;
}

Assistant:

void Sim_CollectNodes_rec( Abc_Obj_t * pRoot, Vec_Ptr_t * vField )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pRoot) )
        return;
    if ( !Abc_NodeIsTravIdPrevious(pRoot) )
        return;
    Abc_NodeSetTravIdCurrent( pRoot );
    Abc_ObjForEachFanin( pRoot, pFanin, i )
        Sim_CollectNodes_rec( pFanin, vField );
    if ( !Abc_ObjIsCo(pRoot) )
        pRoot->pData = (void *)(ABC_PTRUINT_T)Vec_PtrSize(vField);
    Vec_PtrPush( vField, pRoot );
}